

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lev_main.c
# Opt level: O3

int get_object_id(char *s,char c)

{
  char *__s2;
  bool bVar1;
  int iVar2;
  char *pcVar3;
  long lVar4;
  objdescr *poVar5;
  int iVar6;
  int local_3c;
  
  bVar1 = true;
  if (c < '\x01') {
    iVar6 = 0;
    local_3c = 0;
LAB_0010d3b9:
    lVar4 = (long)iVar6;
    poVar5 = obj_descr + lVar4;
    pcVar3 = &objects[lVar4].oc_class;
    do {
      lVar4 = lVar4 + 1;
      if ((!bVar1) && (local_3c != *pcVar3)) goto LAB_0010d43c;
      if ((poVar5->oc_name != (char *)0x0) && (iVar2 = strcmp(s,poVar5->oc_name), iVar2 == 0)) {
        return iVar6;
      }
      iVar6 = iVar6 + 1;
      poVar5 = poVar5 + 1;
      pcVar3 = pcVar3 + 0x28;
    } while ((int)lVar4 != 0x21a);
    if (bVar1) {
      bVar1 = true;
      iVar6 = 0;
      goto LAB_0010d467;
    }
  }
  else {
    local_3c = def_char_to_objclass(c);
    if (local_3c == 0) {
      iVar6 = 0;
      goto LAB_0010d3b9;
    }
    if (local_3c == 0x12) {
      return -1;
    }
    iVar6 = bases[local_3c];
    if (iVar6 < 0x21a) {
      bVar1 = false;
      goto LAB_0010d3b9;
    }
  }
LAB_0010d43c:
  iVar6 = bases[local_3c];
  if (0x219 < iVar6) {
    return -1;
  }
  bVar1 = false;
LAB_0010d467:
  lVar4 = (long)iVar6;
  poVar5 = obj_descr + lVar4;
  pcVar3 = &objects[lVar4].oc_class;
  while( true ) {
    lVar4 = lVar4 + 1;
    if ((!bVar1) && (local_3c != *pcVar3)) {
      return -1;
    }
    __s2 = poVar5->oc_name;
    if ((__s2 != (char *)0x0) && (iVar2 = strcasecmp(s,__s2), iVar2 == 0)) break;
    iVar6 = iVar6 + 1;
    poVar5 = poVar5 + 1;
    pcVar3 = pcVar3 + 0x28;
    if ((int)lVar4 == 0x21a) {
      return -1;
    }
  }
  if (be_verbose != 0) {
    lc_warning("Object type \"%s\" matches \"%s\".",s,__s2);
    return iVar6;
  }
  return iVar6;
}

Assistant:

int get_object_id(char *s, char c)
{
	int i, class;
	const char *objname;

	class = (c > 0) ? def_char_to_objclass(c) : 0;
	if (class == MAXOCLASSES) return ERR;

	for (i = class ? bases[class] : 0; i < NUM_OBJECTS; i++) {
	    if (class && objects[i].oc_class != class) break;
	    objname = obj_descr[i].oc_name;
	    if (objname && !strcmp(s, objname))
		return i;
	}

	for (i = class ? bases[class] : 0; i < NUM_OBJECTS; i++) {
	    if (class && objects[i].oc_class != class) break;
	    objname = obj_descr[i].oc_name;
	    if (objname && !strcasecmp(s, objname)) {
		if (be_verbose)
		    lc_warning("Object type \"%s\" matches \"%s\".", s, objname);
		return i;
	    }
	}

	return ERR;
}